

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O2

Grammar * __thiscall
xercesc_4_0::DOMLSParserImpl::loadGrammar
          (DOMLSParserImpl *this,char *systemId,GrammarType grammarType,bool toCache)

{
  XMLScanner *this_00;
  Grammar *pGVar1;
  DOMException *this_01;
  ResetParseType resetParse;
  
  if ((this->super_AbstractDOMParser).fParseInProgress != true) {
    resetParse.fToCall = (MFPT)DOMLSParserImpl::resetParse;
    resetParse._16_8_ = 0;
    (this->super_AbstractDOMParser).fParseInProgress = true;
    this_00 = (this->super_AbstractDOMParser).fScanner;
    if (grammarType == DTDGrammarType) {
      this_00->fDocTypeHandler = (DocTypeHandler *)0x0;
    }
    resetParse.fObject = this;
    pGVar1 = XMLScanner::loadGrammar(this_00,systemId,(short)grammarType,toCache);
    JanitorMemFunCall<xercesc_4_0::DOMLSParserImpl>::~JanitorMemFunCall(&resetParse);
    return pGVar1;
  }
  this_01 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_01,0xb,0x21,(this->super_AbstractDOMParser).fMemoryManager);
  __cxa_throw(this_01,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

Grammar* DOMLSParserImpl::loadGrammar(const char* const systemId,
                                     const Grammar::GrammarType grammarType,
                                     const bool toCache)
{
    // Avoid multiple entrance
    if (getParseInProgress())
        throw DOMException(DOMException::INVALID_STATE_ERR, XMLDOMMsg::LSParser_ParseInProgress, fMemoryManager);

    ResetParseType  resetParse(this, &DOMLSParserImpl::resetParse);

	Grammar* grammar = 0;

    try
    {
        setParseInProgress(true);
        if (grammarType == Grammar::DTDGrammarType)
            getScanner()->setDocTypeHandler(0);
        grammar = getScanner()->loadGrammar(systemId, grammarType, toCache);
    }
    catch(const OutOfMemoryException&)
    {
        resetParse.release();

        throw;
    }

    return grammar;
}